

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall KeyData_Privkey_testnet_Test::TestBody(KeyData_Privkey_testnet_Test *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_obj;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_obj_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_obj_01;
  initializer_list<unsigned_int> __l;
  allocator local_511;
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  ByteData fingerprint1;
  Privkey privkey1;
  string local_4c0;
  KeyData obj1;
  KeyData obj2;
  KeyData obj3;
  
  std::__cxx11::string::string
            ((string *)&obj1,"cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg",
             (allocator *)&obj2);
  cfd::core::Privkey::FromWif(&privkey1,(string *)&obj1,kCustomChain,true);
  std::__cxx11::string::~string((string *)&obj1);
  std::__cxx11::string::string((string *)&obj1,"3456789a",(allocator *)&obj2);
  cfd::core::ByteData::ByteData(&fingerprint1,(string *)&obj1);
  std::__cxx11::string::~string((string *)&obj1);
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x280000001;
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish._0_4_ = 0x80000003;
  __l._M_len = 3;
  __l._M_array = (iterator)&obj1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&array1,__l,(allocator_type *)&obj2);
  std::__cxx11::string::string((string *)&obj2,"1\'/2/0x80000003",(allocator *)&obj3);
  cfd::core::KeyData::KeyData(&obj1,&privkey1,(string *)&obj2,&fingerprint1);
  std::__cxx11::string::~string((string *)&obj2);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&obj1,(KeyData *)&array1,arr_obj);
  cfd::core::KeyData::KeyData(&obj2,&privkey1,&array1,&fingerprint1);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&obj2,(KeyData *)&array1,arr_obj_00);
  std::__cxx11::string::string((string *)&local_4c0,"1h/2/3H",&local_511);
  cfd::core::KeyData::KeyData(&obj3,&privkey1,&local_4c0,&fingerprint1);
  std::__cxx11::string::~string((string *)&local_4c0);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&obj3,(KeyData *)&array1,arr_obj_01);
  cfd::core::KeyData::~KeyData(&obj3);
  cfd::core::KeyData::~KeyData(&obj2);
  cfd::core::KeyData::~KeyData(&obj1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey1);
  return;
}

Assistant:

TEST(KeyData, Privkey_testnet) {
  Privkey privkey1 = Privkey::FromWif("cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg");
  ByteData fingerprint1("3456789a");
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_TRUE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg",
        obj.GetPrivkey().GetWif().c_str());
    EXPECT_STREQ(
        "02e3cf2c4dca39b502a6f8ba37e5d63a9757492c2155bf99418d9532728cd23d93",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3']02e3cf2c4dca39b502a6f8ba37e5d63a9757492c2155bf99418d9532728cd23d93",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h]cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1(privkey1, "1'/2/0x80000003", fingerprint1);
  check_func(obj1, array1);
  KeyData obj2(privkey1, array1, fingerprint1);
  check_func(obj2, array1);
  KeyData obj3(privkey1, "1h/2/3H", fingerprint1);
  check_func(obj3, array1);
}